

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strftime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  tm *ptVar7;
  char **ppcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  jx9_value *pjVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  time_t t;
  long local_60;
  uint local_58;
  int nLen;
  char *local_50;
  long local_48;
  ulong local_40;
  char *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar15 = pCtx->pRet;
    goto LAB_00134d31;
  }
  pcVar6 = jx9_value_to_string(*apArg,&nLen);
  if (nLen < 1) {
    pjVar15 = pCtx->pRet;
    jx9MemObjRelease(pjVar15);
    (pjVar15->x).rVal = 0.0;
    pjVar15->iFlags = pjVar15->iFlags & 0xfffffe90U | 8;
  }
  if (nArg == 1) {
    time(&t);
  }
  else {
    pjVar15 = apArg[1];
    if ((pjVar15->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar15);
      t = (pjVar15->x).iVal;
      ptVar7 = localtime(&t);
      if (ptVar7 != (tm *)0x0) goto LAB_00134dec;
    }
    time(&t);
  }
LAB_00134dec:
  ptVar7 = localtime(&t);
  uVar2 = ptVar7->tm_hour;
  uVar9 = (ulong)(uint)ptVar7->tm_sec;
  uVar10 = (ulong)(uint)ptVar7->tm_min;
  iVar14 = ptVar7->tm_mon;
  uVar3 = ptVar7->tm_mday;
  uVar4 = ptVar7->tm_yday;
  local_58 = ptVar7->tm_wday;
  uVar16 = ptVar7->tm_year + 0x76c;
  pcVar19 = pcVar6 + nLen;
  uVar1 = iVar14 + 1;
  local_40 = (ulong)(uint)((int)uVar16 % 100);
  uVar13 = (((uint)((int)uVar2 / 6 + ((int)uVar2 >> 0x1f)) >> 1) - ((int)uVar2 >> 0x1f)) * -0xc +
           uVar2 + 1;
  local_50 = "AM";
  if (0xc < (int)uVar2) {
    local_50 = "PM";
  }
  local_38 = "am";
  if (0xc < (int)uVar2) {
    local_38 = "pm";
  }
  local_48 = (long)(int)(iVar14 + (((uint)(iVar14 / 6 + (iVar14 >> 0x1f)) >> 1) - (iVar14 >> 0x1f))
                                  * -0xc);
  local_60 = (long)((int)local_58 % 7);
  pcVar17 = pcVar6;
  while( true ) {
    for (; (pcVar6 < pcVar19 && (*pcVar6 != '%')); pcVar6 = pcVar6 + 1) {
    }
    if (pcVar17 < pcVar6) {
      jx9_value_string(pCtx->pRet,pcVar17,(int)pcVar6 - (int)pcVar17);
    }
    if (pcVar19 <= pcVar6 + 1) break;
    switch(pcVar6[1]) {
    case '%':
      pjVar15 = pCtx->pRet;
      pcVar17 = "%";
      goto LAB_001351f1;
    default:
      goto switchD_00134f66_caseD_26;
    case 'A':
      ppcVar8 = zEngDay;
      lVar12 = local_60;
      goto LAB_0013508e;
    case 'B':
      ppcVar8 = zEngMonth;
      lVar12 = local_48;
LAB_0013508e:
      pcVar17 = ppcVar8[lVar12];
      pjVar15 = pCtx->pRet;
LAB_00135096:
      iVar14 = -1;
      goto LAB_001351f6;
    case 'C':
      pcVar17 = "%2d";
      uVar11 = (ulong)(uint)((int)uVar16 / 100);
      break;
    case 'D':
    case 'x':
      pcVar17 = "%02d/%02d/%02d";
      uVar11 = (ulong)uVar3;
      uVar18 = local_40;
      uVar5 = uVar1;
      goto LAB_001350ca;
    case 'F':
      pcVar17 = "%d-%02d-%02d";
      uVar11 = (ulong)uVar1;
      uVar18 = (ulong)uVar3;
      uVar5 = uVar16;
      goto LAB_001350ca;
    case 'G':
    case 'Y':
      pcVar17 = "%4d";
      uVar11 = (ulong)uVar16;
      break;
    case 'H':
      pcVar17 = "%02d";
      uVar11 = (ulong)uVar2;
      break;
    case 'I':
      pcVar17 = "%02d";
      goto LAB_0013516d;
    case 'M':
      pcVar17 = "%02d";
      uVar11 = uVar10;
      break;
    case 'P':
      pjVar15 = pCtx->pRet;
      pcVar17 = local_38;
      goto LAB_00135186;
    case 'R':
      jx9_result_string_format(pCtx,"%02d:%02d",(ulong)uVar2,uVar10);
      goto switchD_00134f66_caseD_26;
    case 'S':
      pcVar17 = "%02d";
      uVar11 = uVar9;
      break;
    case 'T':
    case 'X':
      pcVar17 = "%02d:%02d:%02d";
      uVar11 = uVar10;
      uVar18 = uVar9;
      uVar5 = uVar2;
LAB_001350ca:
      jx9_result_string_format(pCtx,pcVar17,(ulong)uVar5,uVar11,uVar18);
      goto switchD_00134f66_caseD_26;
    case 'Z':
    case 'z':
      pjVar15 = pCtx->pRet;
      pcVar17 = "GMT";
      goto LAB_00135096;
    case 'a':
      ppcVar8 = zEngDay;
      lVar12 = local_60;
      goto LAB_001351ca;
    case 'b':
    case 'h':
      ppcVar8 = zEngMonth;
      lVar12 = local_48;
LAB_001351ca:
      pcVar17 = ppcVar8[lVar12];
      pjVar15 = pCtx->pRet;
      iVar14 = 3;
      goto LAB_001351f6;
    case 'c':
      jx9_result_string_format
                (pCtx,"%d-%02d-%02d %02d:%02d:%02d",(ulong)uVar16,(ulong)uVar1,(ulong)uVar3,
                 (ulong)uVar2,uVar10,uVar9);
      goto switchD_00134f66_caseD_26;
    case 'd':
    case 'm':
      pcVar17 = "%02d";
      uVar11 = (ulong)uVar1;
      break;
    case 'e':
      pcVar17 = "%2d";
      uVar11 = (ulong)uVar3;
      break;
    case 'g':
    case 'y':
      pcVar17 = "%2d";
      uVar11 = local_40;
      break;
    case 'j':
      pcVar17 = "%03d";
      uVar11 = (ulong)uVar4;
      break;
    case 'l':
      pcVar17 = "%2d";
LAB_0013516d:
      uVar11 = (ulong)uVar13;
      break;
    case 'n':
      pjVar15 = pCtx->pRet;
      pcVar17 = "\n";
      goto LAB_001351f1;
    case 'p':
      pjVar15 = pCtx->pRet;
      pcVar17 = local_50;
LAB_00135186:
      iVar14 = 2;
      goto LAB_001351f6;
    case 'r':
      jx9_result_string_format(pCtx,"%02d:%02d:%02d %s",(ulong)uVar13,uVar10,uVar9,local_50);
      goto switchD_00134f66_caseD_26;
    case 's':
      time(&t);
      pcVar17 = "%u";
      uVar5 = (uint)t;
      goto LAB_00135135;
    case 't':
      pjVar15 = pCtx->pRet;
      pcVar17 = "\t";
LAB_001351f1:
      iVar14 = 1;
LAB_001351f6:
      jx9_value_string(pjVar15,pcVar17,iVar14);
      goto switchD_00134f66_caseD_26;
    case 'u':
      pcVar17 = "%d";
      uVar5 = aISO8601[local_60];
LAB_00135135:
      uVar11 = (ulong)uVar5;
      break;
    case 'w':
      pcVar17 = "%d";
      uVar11 = (ulong)local_58;
    }
    jx9_result_string_format(pCtx,pcVar17,uVar11);
switchD_00134f66_caseD_26:
    pcVar6 = pcVar6 + 2;
    pcVar17 = pcVar6;
  }
  pjVar15 = pCtx->pRet;
  if ((pjVar15->sBlob).nByte != 0) {
    return 0;
  }
LAB_00134d31:
  jx9MemObjRelease(pjVar15);
  (pjVar15->x).rVal = 0.0;
  pjVar15->iFlags = pjVar15->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strftime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	jx9Strftime(pCtx, zFormat, nLen, &sTm);
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing was formatted, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}